

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_senone.c
# Opt level: O3

int32 senone_eval(senone_t *s,int id,gauden_dist_t **dist,int32 n_top)

{
  gauden_dist_t *pgVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  
  if ((id < 0) || (s->n_sen <= (uint)id)) {
    __assert_fail("(id >= 0) && ((uint32)id < s->n_sen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_senone.c"
                  ,0x16f,"int32 senone_eval(senone_t *, int, gauden_dist_t **, int32)");
  }
  if ((0 < n_top) && ((uint)n_top <= s->n_cw)) {
    uVar5 = s->n_feat;
    if (uVar5 == 0) {
      iVar7 = 0;
    }
    else {
      uVar8 = 0;
      iVar7 = 0;
      do {
        pgVar1 = dist[uVar8];
        iVar3 = (int)(float)pgVar1->dist + 0x3ff >> 10;
        if ((float)pgVar1->dist < -2.1474836e+09) {
          iVar3 = -0x200000;
        }
        if (s->n_gauden < 2) {
          pbVar6 = s->pdf[uVar8][pgVar1->id] + (uint)id;
        }
        else {
          pbVar6 = s->pdf[(uint)id][uVar8] + pgVar1->id;
        }
        iVar3 = iVar3 - (uint)*pbVar6;
        if (n_top != 1) {
          uVar4 = 1;
          do {
            iVar2 = (int)(float)pgVar1[uVar4].dist + 0x3ff >> 10;
            if ((float)pgVar1[uVar4].dist < -2.1474836e+09) {
              iVar2 = -0x200000;
            }
            if (s->n_gauden < 2) {
              pbVar6 = s->pdf[uVar8][pgVar1[uVar4].id] + (uint)id;
            }
            else {
              pbVar6 = s->pdf[(uint)id][uVar8] + pgVar1[uVar4].id;
            }
            iVar3 = logmath_add(s->lmath,iVar3,iVar2 - (uint)*pbVar6);
            uVar4 = uVar4 + 1;
          } while ((uint)n_top != uVar4);
          uVar5 = s->n_feat;
        }
        iVar7 = iVar7 - iVar3;
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar5);
    }
    iVar7 = iVar7 / s->aw;
    if (0x7ffe < iVar7) {
      iVar7 = 0x7fff;
    }
    if (iVar7 < -0x7fff) {
      iVar7 = -0x8000;
    }
    return iVar7;
  }
  __assert_fail("(n_top > 0) && ((uint32)n_top <= s->n_cw)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_senone.c"
                ,0x170,"int32 senone_eval(senone_t *, int, gauden_dist_t **, int32)");
}

Assistant:

int32
senone_eval(senone_t * s, int id, gauden_dist_t ** dist, int32 n_top)
{
    int32 scr;                  /* total senone score */
    int32 fden;                 /* Gaussian density */
    int32 fscr;                 /* senone score for one feature */
    int32 fwscr;                /* senone score for one feature, one codeword */
    int32 f, t;
    gauden_dist_t *fdist;

    assert((id >= 0) && ((uint32)id < s->n_sen));
    assert((n_top > 0) && ((uint32)n_top <= s->n_cw));

    scr = 0;

    for (f = 0; (uint32)f < s->n_feat; f++) {
        fdist = dist[f];

        if (fdist[0].dist < (mfcc_t)MAX_NEG_INT32)
            fden = MAX_NEG_INT32 >> SENSCR_SHIFT;
        else
            fden = ((int32)fdist[0].dist + ((1<<SENSCR_SHIFT) - 1)) >> SENSCR_SHIFT;
        fscr = (s->n_gauden > 1)
	    ? (fden + -s->pdf[id][f][fdist[0].id])  /* untransposed */
	    : (fden + -s->pdf[f][fdist[0].id][id]); /* transposed */
        /* Remaining of n_top codewords for feature f */
        for (t = 1; t < n_top; t++) {
            if (fdist[t].dist < (mfcc_t)MAX_NEG_INT32)
                fden = MAX_NEG_INT32 >> SENSCR_SHIFT;
            else
                fden = ((int32)fdist[t].dist + ((1<<SENSCR_SHIFT) - 1)) >> SENSCR_SHIFT;
                
            fwscr = (s->n_gauden > 1) ?
                (fden + -s->pdf[id][f][fdist[t].id]) :
                (fden + -s->pdf[f][fdist[t].id][id]);
            fscr = logmath_add(s->lmath, fscr, fwscr);
        }
	/* Senone scores are also scaled, negated logs3 values.  Hence
	 * we have to negate the stuff we calculated above. */
        scr -= fscr;
    }
    /* Downscale scores. */
    scr /= s->aw;

    /* Avoid overflowing int16 */
    if (scr > 32767)
      scr = 32767;
    if (scr < -32768)
      scr = -32768;
    return scr;
}